

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_ManStrCheck2(char *pStr,int *pnInps,int *pnObjs)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int Marks [32];
  ulong uVar4;
  
  Marks[0x1c] = 0;
  Marks[0x1d] = 0;
  Marks[0x1e] = 0;
  Marks[0x1f] = 0;
  Marks[0x18] = 0;
  Marks[0x19] = 0;
  Marks[0x1a] = 0;
  Marks[0x1b] = 0;
  Marks[0x14] = 0;
  Marks[0x15] = 0;
  Marks[0x16] = 0;
  Marks[0x17] = 0;
  Marks[0x10] = 0;
  Marks[0x11] = 0;
  Marks[0x12] = 0;
  Marks[0x13] = 0;
  Marks[0xc] = 0;
  Marks[0xd] = 0;
  Marks[0xe] = 0;
  Marks[0xf] = 0;
  Marks[8] = 0;
  Marks[9] = 0;
  Marks[10] = 0;
  Marks[0xb] = 0;
  Marks[4] = 0;
  Marks[5] = 0;
  Marks[6] = 0;
  Marks[7] = 0;
  Marks[0] = 0;
  Marks[1] = 0;
  Marks[2] = 0;
  Marks[3] = 0;
  pcVar3 = pStr + 1;
  uVar6 = 0;
  do {
    bVar1 = pcVar3[-1];
    uVar4 = (ulong)bVar1;
    uVar2 = uVar6;
    if (uVar4 < 0x3f) {
      if ((0x7800030000000000U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0) goto LAB_00345b7d;
        pcVar3 = pStr + 1;
        uVar4 = 0;
        break;
      }
    }
    else {
LAB_00345b7d:
      if (((0x22 < bVar1 - 0x5b) || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0)) &&
         (0x19 < (byte)(bVar1 + 0xbf))) {
        if (0x19 < (byte)(bVar1 + 0x9f)) goto LAB_00345c7e;
        if (*pcVar3 == '=') {
          Marks[(byte)(bVar1 + 0x9f)] = 2;
          uVar2 = bVar1 - 0x61;
          if ((int)(bVar1 - 0x61) < (int)uVar6) {
            uVar2 = uVar6;
          }
        }
      }
    }
    uVar6 = uVar2;
    pcVar3 = pcVar3 + 1;
  } while( true );
LAB_00345bd1:
  bVar1 = pcVar3[-1];
  uVar9 = (ulong)bVar1;
  iVar7 = (int)uVar4;
  uVar8 = uVar4;
  if (uVar9 < 0x3f) {
    if ((0x7800030000000000U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 != 0) goto LAB_00345be7;
      uVar9 = (ulong)(iVar7 + 1U);
      uVar8 = 0;
      goto LAB_00345c3f;
    }
  }
  else {
LAB_00345be7:
    if (((0x22 < bVar1 - 0x5b) || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0)) &&
       (0x19 < (byte)(bVar1 + 0xbf))) {
      bVar5 = bVar1 + 0x9f;
      if (0x19 < bVar5) goto LAB_00345c7e;
      if ((*pcVar3 != '=') && (Marks[bVar5] != 2)) {
        Marks[bVar5] = 1;
        uVar8 = (ulong)(bVar1 - 0x61);
        if ((int)(bVar1 - 0x61) < iVar7) {
          uVar8 = uVar4;
        }
      }
    }
  }
  pcVar3 = pcVar3 + 1;
  uVar4 = uVar8;
  goto LAB_00345bd1;
LAB_00345c7e:
  uVar4 = (ulong)(uint)(int)(char)bVar1;
  pcVar3 = "String \"%s\" contains unrecognized symbol \'%c\'.\n";
  goto LAB_00345cb8;
LAB_00345c3f:
  if (uVar6 < uVar8) goto LAB_00345c56;
  if (Marks[uVar8] == 0) {
    iVar7 = (int)uVar8;
    pcVar3 = "String \"%s\" has no symbol \'%c\'.\n";
    goto LAB_00345cb0;
  }
  uVar8 = uVar8 + 1;
  goto LAB_00345c3f;
LAB_00345c56:
  for (uVar8 = 0; uVar8 <= uVar4; uVar8 = uVar8 + 1) {
    if (Marks[uVar8] == 2) {
      iVar7 = (int)uVar8;
      pcVar3 = "String \"%s\" has definition of input variable \'%c\'.\n";
LAB_00345cb0:
      uVar4 = (ulong)(iVar7 + 0x61);
      goto LAB_00345cb8;
    }
  }
  uVar2 = iVar7 + 0x62;
  while( true ) {
    uVar4 = (ulong)uVar2;
    if (uVar6 < uVar9) {
      *pnInps = iVar7 + 1U;
      *pnObjs = uVar6 + 1;
      return 1;
    }
    if (Marks[uVar9] == 1) break;
    uVar9 = uVar9 + 1;
    uVar2 = uVar2 + 1;
  }
  pcVar3 = "String \"%s\" has no definition for internal variable \'%c\'.\n";
LAB_00345cb8:
  Ifn_ErrorMessage(pcVar3,pStr,uVar4);
  return 0;
}

Assistant:

int Ifn_ManStrCheck2( char * pStr, int * pnInps, int * pnObjs )
{
    int i, Marks[32] = {0}, MaxVar = 0, MaxDef = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] == '=' )
                Marks[pStr[i] - 'a'] = 2, MaxDef = Abc_MaxInt(MaxDef, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] != '=' && Marks[pStr[i] - 'a'] != 2 )
                Marks[pStr[i] - 'a'] = 1, MaxVar = Abc_MaxInt(MaxVar, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    MaxVar++;
    MaxDef++;
    for ( i = 0; i < MaxDef; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    for ( i = 0; i < MaxVar; i++ )
        if ( Marks[i] == 2 )
            return Ifn_ErrorMessage( "String \"%s\" has definition of input variable \'%c\'.\n", pStr, 'a' + i );
    for ( i = MaxVar; i < MaxDef; i++ )
        if ( Marks[i] == 1 )
            return Ifn_ErrorMessage( "String \"%s\" has no definition for internal variable \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar;
    *pnObjs = MaxDef;
    return 1;
}